

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::ConnectHttpService::SimpleHttpService::request
          (SimpleHttpService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  long *plVar1;
  HttpHeaderTable *node;
  undefined4 in_register_00000034;
  Own<kj::AsyncOutputStream,_std::nullptr_t> out;
  undefined8 *local_98;
  long *local_90;
  HttpHeaders local_88;
  undefined1 local_28 [16];
  
  HttpHeaders::HttpHeaders
            (&local_88,*(HttpHeaderTable **)(CONCAT44(in_register_00000034,method) + 8));
  local_28[0] = 0;
  (**(out.disposer)->_vptr_Disposer)(&local_98,out.disposer,200,"OK",3,&local_88,local_28);
  HttpHeaders::~HttpHeaders(&local_88);
  (**(code **)*local_90)(&local_88,local_90,kj::_::ByteLiteral<12ul>,0xb);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_88);
  node = local_88.table;
  if (local_88.table != (HttpHeaderTable *)0x0) {
    local_88.table = (HttpHeaderTable *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  plVar1 = local_90;
  if (local_90 != (long *)0x0) {
    local_90 = (long *)0x0;
    (**(code **)*local_98)(local_98,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
        HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
        kj::AsyncInputStream& requestBody, Response& response) override {
      auto out = response.send(200, "OK"_kj, HttpHeaders(table));
      return out->write("hello there"_kjb).attach(kj::mv(out));
    }